

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  uint32_t uVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  FieldDescriptor *this_00;
  undefined4 extraout_var_00;
  FieldDescriptor *this_01;
  RepeatedPtrFieldBase *this_02;
  undefined4 extraout_var_01;
  LogMessage *other;
  uint64_t uVar7;
  string *psVar8;
  int64_t iVar9;
  Message *pMVar10;
  Message *pMVar11;
  Reflection *this_03;
  undefined1 *this_04;
  float value;
  double value_00;
  LogFinisher local_c1;
  const_iterator it;
  string local_a8;
  string local_88;
  LogMessage local_68;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  this_01 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar3));
  this_02 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_02 == (RepeatedPtrFieldBase *)0x0) {
    this_02 = &Arena::
               CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                         ((this->
                          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                          ).super_MapFieldBase.arena_)->super_RepeatedPtrFieldBase;
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)this_02;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this_02);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::iterator_base(&it.it_,&(this->map_).elements_);
  while (it.it_.node_ != (Node *)0x0) {
    iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])
                      (this->default_entry_,
                       (this->
                       super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                       ).super_MapFieldBase.arena_);
    pMVar11 = (Message *)CONCAT44(extraout_var_01,iVar3);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,pMVar11);
    pNVar1 = it.it_.node_;
    CVar4 = FieldDescriptor::cpp_type(this_00);
    switch(CVar4) {
    case CPPTYPE_INT32:
      iVar6 = MapKey::GetInt32Value((MapKey *)pNVar1);
      Reflection::SetInt32(this_03,pMVar11,this_00,iVar6);
      break;
    case CPPTYPE_INT64:
      iVar9 = MapKey::GetInt64Value((MapKey *)pNVar1);
      Reflection::SetInt64(this_03,pMVar11,this_00,iVar9);
      break;
    case CPPTYPE_UINT32:
      uVar5 = MapKey::GetUInt32Value((MapKey *)pNVar1);
      Reflection::SetUInt32(this_03,pMVar11,this_00,uVar5);
      break;
    case CPPTYPE_UINT64:
      uVar7 = MapKey::GetUInt64Value((MapKey *)pNVar1);
      Reflection::SetUInt64(this_03,pMVar11,this_00,uVar7);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x1d8);
      other = LogMessage::operator<<(&local_68,"Can\'t get here.");
      LogFinisher::operator=(&local_c1,other);
      LogMessage::~LogMessage(&local_68);
      break;
    case CPPTYPE_BOOL:
      bVar2 = MapKey::GetBoolValue((MapKey *)pNVar1);
      Reflection::SetBool(this_03,pMVar11,this_00,bVar2);
      break;
    case CPPTYPE_STRING:
      psVar8 = MapKey::GetStringValue_abi_cxx11_((MapKey *)pNVar1);
      std::__cxx11::string::string((string *)&local_88,(string *)psVar8);
      Reflection::SetString(this_03,pMVar11,this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    pNVar1 = it.it_.node_;
    CVar4 = FieldDescriptor::cpp_type(this_01);
    if (CVar4 - CPPTYPE_INT32 < 10) {
      this_04 = &pNVar1->field_0x28;
      switch(CVar4) {
      case CPPTYPE_INT32:
        iVar6 = MapValueConstRef::GetInt32Value((MapValueConstRef *)this_04);
        Reflection::SetInt32(this_03,pMVar11,this_01,iVar6);
        break;
      case CPPTYPE_INT64:
        iVar9 = MapValueConstRef::GetInt64Value((MapValueConstRef *)this_04);
        Reflection::SetInt64(this_03,pMVar11,this_01,iVar9);
        break;
      case CPPTYPE_UINT32:
        uVar5 = MapValueConstRef::GetUInt32Value((MapValueConstRef *)this_04);
        Reflection::SetUInt32(this_03,pMVar11,this_01,uVar5);
        break;
      case CPPTYPE_UINT64:
        uVar7 = MapValueConstRef::GetUInt64Value((MapValueConstRef *)this_04);
        Reflection::SetUInt64(this_03,pMVar11,this_01,uVar7);
        break;
      case CPPTYPE_DOUBLE:
        value_00 = MapValueConstRef::GetDoubleValue((MapValueConstRef *)this_04);
        Reflection::SetDouble(this_03,pMVar11,this_01,value_00);
        break;
      case CPPTYPE_FLOAT:
        value = MapValueConstRef::GetFloatValue((MapValueConstRef *)this_04);
        Reflection::SetFloat(this_03,pMVar11,this_01,value);
        break;
      case CPPTYPE_BOOL:
        bVar2 = MapValueConstRef::GetBoolValue((MapValueConstRef *)this_04);
        Reflection::SetBool(this_03,pMVar11,this_01,bVar2);
        break;
      case CPPTYPE_ENUM:
        iVar3 = MapValueConstRef::GetEnumValue((MapValueConstRef *)this_04);
        Reflection::SetEnumValue(this_03,pMVar11,this_01,iVar3);
        break;
      case CPPTYPE_STRING:
        psVar8 = MapValueConstRef::GetStringValue_abi_cxx11_((MapValueConstRef *)this_04);
        std::__cxx11::string::string((string *)&local_a8,(string *)psVar8);
        Reflection::SetString(this_03,pMVar11,this_01,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        break;
      case CPPTYPE_MESSAGE:
        pMVar10 = MapValueConstRef::GetMessageValue((MapValueConstRef *)this_04);
        pMVar11 = Reflection::MutableMessage(this_03,pMVar11,this_01,(MessageFactory *)0x0);
        (*(pMVar11->super_MessageLite)._vptr_MessageLite[0xd])(pMVar11,pMVar10);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::operator++(&it.it_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  if (MapFieldBase::repeated_field_ == nullptr) {
    MapFieldBase::repeated_field_ =
        Arena::CreateMessage<RepeatedPtrField<Message> >(MapFieldBase::arena_);
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New(MapFieldBase::arena_);
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}